

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_open(AMQP_VALUE value,OPEN_HANDLE *open_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_a8;
  fields properties;
  AMQP_VALUE desired_capabilities_array;
  char *desired_capabilities;
  AMQP_VALUE offered_capabilities_array;
  char *offered_capabilities;
  AMQP_VALUE incoming_locales_array;
  ietf_language_tag incoming_locales;
  AMQP_VALUE outgoing_locales_array;
  ietf_language_tag outgoing_locales;
  uint16_t local_56;
  milliseconds idle_time_out;
  uint16_t channel_max;
  uint32_t max_frame_size;
  char *hostname;
  char *container_id;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  OPEN_INSTANCE *open_instance;
  OPEN_HANDLE *ppOStack_18;
  int result;
  OPEN_HANDLE *open_handle_local;
  AMQP_VALUE value_local;
  
  ppOStack_18 = open_handle;
  open_handle_local = (OPEN_HANDLE *)value;
  list_value = (AMQP_VALUE)open_create_internal();
  *ppOStack_18 = (OPEN_HANDLE)list_value;
  if (*ppOStack_18 == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x2f9;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)open_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      open_destroy(*ppOStack_18);
      open_instance._4_4_ = 0x301;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          open_instance._4_4_ = 0x335;
        }
        else {
          container_id = (char *)amqpvalue_get_list_item(pAStack_30,0);
          if ((AMQP_VALUE)container_id == (AMQP_VALUE)0x0) {
            open_destroy(*ppOStack_18);
            open_instance._4_4_ = 0x317;
          }
          else {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy((AMQP_VALUE)container_id);
              open_destroy(*ppOStack_18);
              open_instance._4_4_ = 0x321;
            }
            else {
              iVar1 = amqpvalue_get_string((AMQP_VALUE)container_id,&hostname);
              if (iVar1 == 0) {
                amqpvalue_destroy((AMQP_VALUE)container_id);
                if ((1 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,1),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_string
                                        ((AMQP_VALUE)container_id,(char **)&stack0xffffffffffffffb0)
                     , iVar1 != 0)) {
                    amqpvalue_destroy((AMQP_VALUE)container_id);
                    open_destroy(*ppOStack_18);
                    return 0x34d;
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((2 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,2),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_uint((AMQP_VALUE)container_id,&idle_time_out),
                     iVar1 != 0)) {
                    amqpvalue_destroy((AMQP_VALUE)container_id);
                    open_destroy(*ppOStack_18);
                    return 0x36a;
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((3 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,3),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_ushort((AMQP_VALUE)container_id,&local_56), iVar1 != 0))
                  {
                    amqpvalue_destroy((AMQP_VALUE)container_id);
                    open_destroy(*ppOStack_18);
                    return 0x387;
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((4 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,4),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_uint((AMQP_VALUE)container_id,
                                                 (uint32_t *)((long)&outgoing_locales + 4)),
                     iVar1 != 0)) {
                    amqpvalue_destroy((AMQP_VALUE)container_id);
                    open_destroy(*ppOStack_18);
                    return 0x3a4;
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((5 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,5),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    outgoing_locales_array = (AMQP_VALUE)0x0;
                    AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                        (iVar1 = amqpvalue_get_array((AMQP_VALUE)container_id,
                                                     (AMQP_VALUE *)&incoming_locales), iVar1 != 0))
                       && (iVar1 = amqpvalue_get_symbol
                                             ((AMQP_VALUE)container_id,
                                              (char **)&outgoing_locales_array), iVar1 != 0)) {
                      amqpvalue_destroy((AMQP_VALUE)container_id);
                      open_destroy(*ppOStack_18);
                      return 0x3c3;
                    }
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((6 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,6),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    incoming_locales_array = (AMQP_VALUE)0x0;
                    AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                        (iVar1 = amqpvalue_get_array((AMQP_VALUE)container_id,
                                                     (AMQP_VALUE *)&offered_capabilities),
                        iVar1 != 0)) &&
                       (iVar1 = amqpvalue_get_symbol
                                          ((AMQP_VALUE)container_id,(char **)&incoming_locales_array
                                          ), iVar1 != 0)) {
                      amqpvalue_destroy((AMQP_VALUE)container_id);
                      open_destroy(*ppOStack_18);
                      return 0x3e2;
                    }
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((7 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,7),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    offered_capabilities_array = (AMQP_VALUE)0x0;
                    AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                        (iVar1 = amqpvalue_get_array((AMQP_VALUE)container_id,
                                                     (AMQP_VALUE *)&desired_capabilities),
                        iVar1 != 0)) &&
                       (iVar1 = amqpvalue_get_symbol
                                          ((AMQP_VALUE)container_id,
                                           (char **)&offered_capabilities_array), iVar1 != 0)) {
                      amqpvalue_destroy((AMQP_VALUE)container_id);
                      open_destroy(*ppOStack_18);
                      return 0x401;
                    }
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((8 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,8),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    desired_capabilities_array = (AMQP_VALUE)0x0;
                    AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                        (iVar1 = amqpvalue_get_array((AMQP_VALUE)container_id,&properties),
                        iVar1 != 0)) &&
                       (iVar1 = amqpvalue_get_symbol
                                          ((AMQP_VALUE)container_id,
                                           (char **)&desired_capabilities_array), iVar1 != 0)) {
                      amqpvalue_destroy((AMQP_VALUE)container_id);
                      open_destroy(*ppOStack_18);
                      return 0x420;
                    }
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                if ((9 < item_value._4_4_) &&
                   (container_id = (char *)amqpvalue_get_list_item(pAStack_30,9),
                   (AMQP_VALUE)container_id != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)container_id);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_map((AMQP_VALUE)container_id,&local_a8), iVar1 != 0)) {
                    amqpvalue_destroy((AMQP_VALUE)container_id);
                    open_destroy(*ppOStack_18);
                    return 0x43d;
                  }
                  amqpvalue_destroy((AMQP_VALUE)container_id);
                }
                pAVar3 = amqpvalue_clone((AMQP_VALUE)open_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                open_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy((AMQP_VALUE)container_id);
                open_destroy(*ppOStack_18);
                open_instance._4_4_ = 0x32b;
              }
            }
          }
        }
      }
      else {
        open_instance._4_4_ = 0x308;
      }
    }
  }
  return open_instance._4_4_;
}

Assistant:

int amqpvalue_get_open(AMQP_VALUE value, OPEN_HANDLE* open_handle)
{
    int result;
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open_create_internal();
    *open_handle = open_instance;
    if (*open_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            open_destroy(*open_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* container-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                open_destroy(*open_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                open_destroy(*open_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* container_id;
                                if (amqpvalue_get_string(item_value, &container_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* hostname */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* hostname;
                                if (amqpvalue_get_string(item_value, &hostname) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* max-frame-size */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t max_frame_size;
                                if (amqpvalue_get_uint(item_value, &max_frame_size) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* channel-max */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint16_t channel_max;
                                if (amqpvalue_get_ushort(item_value, &channel_max) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* idle-time-out */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                milliseconds idle_time_out;
                                if (amqpvalue_get_milliseconds(item_value, &idle_time_out) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* outgoing-locales */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ietf_language_tag outgoing_locales = NULL;
                                AMQP_VALUE outgoing_locales_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &outgoing_locales_array) != 0)) &&
                                    (amqpvalue_get_ietf_language_tag(item_value, &outgoing_locales) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incoming-locales */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ietf_language_tag incoming_locales = NULL;
                                AMQP_VALUE incoming_locales_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &incoming_locales_array) != 0)) &&
                                    (amqpvalue_get_ietf_language_tag(item_value, &incoming_locales) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    open_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}